

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_md5.c
# Opt level: O0

void ngx_md5_final(u_char *result,ngx_md5_t *ctx)

{
  ulong uVar1;
  ulong local_28;
  size_t free;
  size_t used;
  ngx_md5_t *ctx_local;
  u_char *result_local;
  
  uVar1 = ctx->bytes & 0x3f;
  free = uVar1 + 1;
  ctx->buffer[uVar1] = 0x80;
  local_28 = 0x40 - free;
  if (local_28 < 8) {
    memset(ctx->buffer + uVar1 + 1,0,local_28);
    ngx_md5_body(ctx,ctx->buffer,0x40);
    free = 0;
    local_28 = 0x40;
  }
  memset(ctx->buffer + free,0,local_28 - 8);
  ctx->bytes = ctx->bytes << 3;
  ctx->buffer[0x38] = (u_char)ctx->bytes;
  ctx->buffer[0x39] = (u_char)(ctx->bytes >> 8);
  ctx->buffer[0x3a] = (u_char)(ctx->bytes >> 0x10);
  ctx->buffer[0x3b] = (u_char)(ctx->bytes >> 0x18);
  ctx->buffer[0x3c] = (u_char)(ctx->bytes >> 0x20);
  ctx->buffer[0x3d] = (u_char)(ctx->bytes >> 0x28);
  ctx->buffer[0x3e] = (u_char)(ctx->bytes >> 0x30);
  ctx->buffer[0x3f] = (u_char)(ctx->bytes >> 0x38);
  ngx_md5_body(ctx,ctx->buffer,0x40);
  *result = (u_char)ctx->a;
  result[1] = (u_char)(ctx->a >> 8);
  result[2] = (u_char)(ctx->a >> 0x10);
  result[3] = (u_char)(ctx->a >> 0x18);
  result[4] = (u_char)ctx->b;
  result[5] = (u_char)(ctx->b >> 8);
  result[6] = (u_char)(ctx->b >> 0x10);
  result[7] = (u_char)(ctx->b >> 0x18);
  result[8] = (u_char)ctx->c;
  result[9] = (u_char)(ctx->c >> 8);
  result[10] = (u_char)(ctx->c >> 0x10);
  result[0xb] = (u_char)(ctx->c >> 0x18);
  result[0xc] = (u_char)ctx->d;
  result[0xd] = (u_char)(ctx->d >> 8);
  result[0xe] = (u_char)(ctx->d >> 0x10);
  result[0xf] = (u_char)(ctx->d >> 0x18);
  memset(ctx,0,0x58);
  return;
}

Assistant:

void
ngx_md5_final(u_char result[16], ngx_md5_t *ctx)
{
    size_t  used, free;

    used = (size_t) (ctx->bytes & 0x3f);

    ctx->buffer[used++] = 0x80;

    free = 64 - used;

    if (free < 8) {
        ngx_memzero(&ctx->buffer[used], free);
        (void) ngx_md5_body(ctx, ctx->buffer, 64);
        used = 0;
        free = 64;
    }

    ngx_memzero(&ctx->buffer[used], free - 8);

    ctx->bytes <<= 3;
    ctx->buffer[56] = (u_char) ctx->bytes;
    ctx->buffer[57] = (u_char) (ctx->bytes >> 8);
    ctx->buffer[58] = (u_char) (ctx->bytes >> 16);
    ctx->buffer[59] = (u_char) (ctx->bytes >> 24);
    ctx->buffer[60] = (u_char) (ctx->bytes >> 32);
    ctx->buffer[61] = (u_char) (ctx->bytes >> 40);
    ctx->buffer[62] = (u_char) (ctx->bytes >> 48);
    ctx->buffer[63] = (u_char) (ctx->bytes >> 56);

    (void) ngx_md5_body(ctx, ctx->buffer, 64);

    result[0] = (u_char) ctx->a;
    result[1] = (u_char) (ctx->a >> 8);
    result[2] = (u_char) (ctx->a >> 16);
    result[3] = (u_char) (ctx->a >> 24);
    result[4] = (u_char) ctx->b;
    result[5] = (u_char) (ctx->b >> 8);
    result[6] = (u_char) (ctx->b >> 16);
    result[7] = (u_char) (ctx->b >> 24);
    result[8] = (u_char) ctx->c;
    result[9] = (u_char) (ctx->c >> 8);
    result[10] = (u_char) (ctx->c >> 16);
    result[11] = (u_char) (ctx->c >> 24);
    result[12] = (u_char) ctx->d;
    result[13] = (u_char) (ctx->d >> 8);
    result[14] = (u_char) (ctx->d >> 16);
    result[15] = (u_char) (ctx->d >> 24);

    ngx_memzero(ctx, sizeof(*ctx));
}